

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O0

int run_test_udp_open(void)

{
  int iVar1;
  uv_os_sock_t uVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  undefined1 auVar4 [16];
  int r;
  uv_os_sock_t sock;
  uv_udp_t client2;
  uv_udp_t client;
  uv_buf_t buf;
  sockaddr_in addr;
  
  auVar4 = uv_buf_init("PING",4);
  buf.base = auVar4._8_8_;
  client.write_completed_queue[1] = auVar4._0_8_;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&buf.len);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0x91,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
    abort();
  }
  startup();
  uVar2 = create_udp_socket();
  uVar3 = uv_default_loop();
  iVar1 = uv_udp_init(uVar3,client2.write_completed_queue + 1);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0x97,"r == 0");
    abort();
  }
  iVar1 = uv_udp_open(client2.write_completed_queue + 1,uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0x9a,"r == 0");
    abort();
  }
  iVar1 = uv_udp_bind(client2.write_completed_queue + 1,&buf.len,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0x9d,"r == 0");
    abort();
  }
  iVar1 = uv_udp_recv_start(client2.write_completed_queue + 1,alloc_cb,recv_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xa0,"r == 0");
    abort();
  }
  iVar1 = uv_udp_send(&send_req,client2.write_completed_queue + 1,client.write_completed_queue + 1,1
                      ,&buf.len,send_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xa8,"r == 0");
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_udp_init(uVar3,&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xad,"r == 0");
    abort();
  }
  iVar1 = uv_udp_open(&r,uVar2);
  if (iVar1 != -0x11) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xb0,"r == UV_EEXIST");
    abort();
  }
  uv_close(&r,0);
  uVar3 = uv_default_loop();
  uv_run(uVar3,0);
  if (send_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xba,"send_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xbb,"close_cb_called == 1");
    abort();
  }
  if (client._88_8_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xbd,"client.send_queue_size == 0");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0xbf,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT(r == 0);

    r = uv_udp_open(&client2, sock);
    ASSERT(r == UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}